

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Vector<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,uint *args)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(__return_storage_ptr__,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (__return_storage_ptr__,args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}